

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCommand::HandleGetRuntimeDependenciesCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *pcVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar2;
  int iVar3;
  Mode MVar4;
  string *psVar5;
  size_type sVar6;
  ostream *poVar7;
  cmState *this_00;
  cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
  *pcVar8;
  cmArgumentParser<Arguments> *pcVar9;
  reference pbVar10;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *this_01;
  reference __x;
  _Self *__x_00;
  reference file2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar11;
  ulong uVar12;
  iterator iVar13;
  iterator iVar14;
  reference pbVar15;
  char *pcVar16;
  static_string_view sVar17;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  cVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f38;
  undefined1 local_f18 [8];
  string val_3;
  string val_2;
  string val_1;
  undefined1 local_e98 [8];
  ostringstream e_4;
  _Self local_d20;
  _Self local_d18;
  iterator it_1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_cf8;
  const_iterator local_cf0;
  string local_ce8;
  reference local_cc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path;
  iterator __end4;
  iterator __begin4;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  ostringstream e_3;
  undefined1 local_b30 [8];
  string pathsStr;
  undefined1 local_af0 [8];
  string varName;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_ab8;
  const_iterator local_ab0;
  undefined1 local_aa8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *firstPath;
  _Self local_a78;
  iterator it;
  bool unique;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *val;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  conflictingDeps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unresolvedDeps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  deps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_9e0;
  undefined1 local_9c8 [8];
  cmRuntimeDependencyArchive archive;
  undefined1 local_868 [8];
  ostringstream e_2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_6f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6e8;
  string local_6e0;
  undefined1 local_6c0 [8];
  ostringstream e_1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_548;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_540;
  iterator argIt;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_528;
  undefined1 local_518 [8];
  Arguments parsedArgs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keywordsMissingValues;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unrecognizedArguments;
  cmArgumentParser<Arguments> local_2e8;
  allocator<char> local_2c1;
  string local_2c0;
  undefined4 local_29c;
  string local_298;
  undefined1 local_278 [8];
  ostringstream e;
  allocator<char> local_f9;
  string local_f8;
  undefined1 local_d8 [8];
  string platform;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_b0;
  undefined1 local_af;
  allocator<char> local_ae;
  allocator<char> local_ad [20];
  allocator<char> local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70 [32];
  string local_50 [32];
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFileCommand *this_local;
  
  local_20 = (undefined1  [8])args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  if ((HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
       ::supportedPlatforms_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                   ::supportedPlatforms_abi_cxx11_), iVar3 != 0)) {
    local_af = 1;
    local_98 = &local_90;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"Windows",&local_99);
    local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_70,"Linux",local_ad);
    local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_50,"Darwin",&local_ae);
    local_af = 0;
    local_30 = &local_90;
    local_28 = 3;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(platform.field_2._M_local_buf + 0xf));
    __l._M_len = local_28;
    __l._M_array = local_30;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set(&HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
           ::supportedPlatforms_abi_cxx11_,__l,&local_b0,
          (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(platform.field_2._M_local_buf + 0xf));
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(platform.field_2._M_local_buf + 0xf));
    local_f80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_30;
    do {
      local_f80 = local_f80 + -1;
      std::__cxx11::string::~string((string *)local_f80);
    } while (local_f80 != &local_90);
    std::allocator<char>::~allocator(&local_ae);
    std::allocator<char>::~allocator(local_ad);
    std::allocator<char>::~allocator(&local_99);
    __cxa_atexit(std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~set,&HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::supportedPlatforms_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::supportedPlatforms_abi_cxx11_);
  }
  pcVar1 = (this->super_cmCommand).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"CMAKE_HOST_SYSTEM_NAME",&local_f9);
  psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_f8);
  std::__cxx11::string::string((string *)local_d8,(string *)psVar5);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  sVar6 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(&HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                   ::supportedPlatforms_abi_cxx11_,(key_type *)local_d8);
  if (sVar6 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
    poVar7 = std::operator<<((ostream *)local_278,
                             "GET_RUNTIME_DEPENDENCIES is not supported on system \"");
    poVar7 = std::operator<<(poVar7,(string *)local_d8);
    std::operator<<(poVar7,"\"");
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(&this->super_cmCommand,&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    cmSystemTools::SetFatalErrorOccured();
    this_local._7_1_ = 0;
    local_29c = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
    goto LAB_001f6cd1;
  }
  this_00 = cmMakefile::GetState((this->super_cmCommand).Makefile);
  MVar4 = cmState::GetMode(this_00);
  if (MVar4 == Project) {
    pcVar1 = (this->super_cmCommand).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c0,
               "You have used file(GET_RUNTIME_DEPENDENCIES) in project mode. This is probably not what you intended to do. Instead, please consider using it in an install(CODE) or install(SCRIPT) command. For example:\n  install(CODE [[\n    file(GET_RUNTIME_DEPENDENCIES\n      # ...\n      )\n    ]])"
               ,&local_2c1);
    cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::allocator<char>::~allocator(&local_2c1);
  }
  if ((HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
       ::parser == '\0') &&
     (iVar3 = __cxa_guard_acquire(&HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                   ::parser), iVar3 != 0)) {
    local_2e8.Bindings.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2e8.Bindings.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2e8.Bindings.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmArgumentParser<Arguments>::cmArgumentParser(&local_2e8);
    sVar17 = ::cm::operator____s("RESOLVED_DEPENDENCIES_VAR",0x19);
    pcVar8 = (cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
              *)cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                ::Bind<std::__cxx11::string>
                          ((cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                            *)&local_2e8,sVar17,0);
    sVar17 = ::cm::operator____s("UNRESOLVED_DEPENDENCIES_VAR",0x1b);
    pcVar8 = (cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
              *)cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                ::Bind<std::__cxx11::string>(pcVar8,sVar17,0x20);
    sVar17 = ::cm::operator____s("CONFLICTING_DEPENDENCIES_PREFIX",0x1f);
    pcVar8 = (cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
              *)cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                ::Bind<std::__cxx11::string>(pcVar8,sVar17,0x40);
    sVar17 = ::cm::operator____s("BUNDLE_EXECUTABLE",0x11);
    pcVar8 = (cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
              *)cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                ::Bind<std::__cxx11::string>(pcVar8,sVar17,0x60);
    sVar17 = ::cm::operator____s("EXECUTABLES",0xb);
    pcVar8 = (cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
              *)cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                ::Bind<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          (pcVar8,sVar17,0x80);
    sVar17 = ::cm::operator____s("LIBRARIES",9);
    pcVar8 = (cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
              *)cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                ::Bind<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          (pcVar8,sVar17,0x98);
    sVar17 = ::cm::operator____s("MODULES",7);
    pcVar8 = (cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
              *)cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                ::Bind<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          (pcVar8,sVar17,200);
    sVar17 = ::cm::operator____s("DIRECTORIES",0xb);
    pcVar8 = (cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
              *)cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                ::Bind<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          (pcVar8,sVar17,0xb0);
    sVar17 = ::cm::operator____s("PRE_INCLUDE_REGEXES",0x13);
    pcVar8 = (cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
              *)cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                ::Bind<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          (pcVar8,sVar17,0xe0);
    sVar17 = ::cm::operator____s("PRE_EXCLUDE_REGEXES",0x13);
    pcVar8 = (cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
              *)cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                ::Bind<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          (pcVar8,sVar17,0xf8);
    sVar17 = ::cm::operator____s("POST_INCLUDE_REGEXES",0x14);
    pcVar8 = (cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
              *)cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                ::Bind<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          (pcVar8,sVar17,0x110);
    sVar17 = ::cm::operator____s("POST_EXCLUDE_REGEXES",0x14);
    pcVar9 = cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
             ::Bind<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                       (pcVar8,sVar17,0x128);
    cmArgumentParser<Arguments>::cmArgumentParser
              (&HandleGetRuntimeDependenciesCommand::parser,pcVar9);
    cmArgumentParser<Arguments>::~cmArgumentParser(&local_2e8);
    __cxa_atexit(cmArgumentParser<Arguments>::~cmArgumentParser,
                 &HandleGetRuntimeDependenciesCommand::parser,&__dso_handle);
    __cxa_guard_release(&HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::parser);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&keywordsMissingValues.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&parsedArgs.PostExcludeRegexes.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cVar18 = cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_20);
  argIt._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)cVar18.Begin._M_current;
  local_528 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::advance((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)&argIt,1);
  cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
  ::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Arguments *)local_518,
             (cmArgumentParser<cmFileCommand::HandleGetRuntimeDependenciesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
              *)&HandleGetRuntimeDependenciesCommand::parser,&local_528,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&keywordsMissingValues.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&parsedArgs.PostExcludeRegexes.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_540._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&keywordsMissingValues.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_548._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&keywordsMissingValues.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar2 = __gnu_cxx::operator!=(&local_540,&local_548);
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6c0);
    poVar7 = std::operator<<((ostream *)local_6c0,"Unrecognized argument: \"");
    pbVar10 = __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&local_540);
    poVar7 = std::operator<<(poVar7,(string *)pbVar10);
    std::operator<<(poVar7,"\"");
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(&this->super_cmCommand,&local_6e0);
    std::__cxx11::string::~string((string *)&local_6e0);
    cmSystemTools::SetFatalErrorOccured();
    this_local._7_1_ = 0;
    local_29c = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6c0);
  }
  else {
    local_6e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&parsedArgs.PostExcludeRegexes.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_540._M_current = local_6e8;
    local_6f0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&parsedArgs.PostExcludeRegexes.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar2 = __gnu_cxx::operator!=(&local_540,&local_6f0);
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_868);
      poVar7 = std::operator<<((ostream *)local_868,"Keyword missing value: ");
      pbVar10 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_540);
      std::operator<<(poVar7,(string *)pbVar10);
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(&this->super_cmCommand,
                          (string *)
                          &archive.UnresolvedPaths._M_t._M_impl.super__Rb_tree_header._M_node_count)
      ;
      std::__cxx11::string::~string
                ((string *)&archive.UnresolvedPaths._M_t._M_impl.super__Rb_tree_header._M_node_count
                );
      cmSystemTools::SetFatalErrorOccured();
      this_local._7_1_ = 0;
      local_29c = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_868);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_9e0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&parsedArgs.Libraries.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::string
                ((string *)
                 &deps.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (string *)(parsedArgs.ConflictingDependenciesPrefix.field_2._M_local_buf + 8));
      cmRuntimeDependencyArchive::cmRuntimeDependencyArchive
                ((cmRuntimeDependencyArchive *)local_9c8,&this->super_cmCommand,&local_9e0,
                 (string *)
                 &deps.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&parsedArgs.Modules.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&parsedArgs.PreIncludeRegexes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&parsedArgs.PreExcludeRegexes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&parsedArgs.PostIncludeRegexes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &deps.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_9e0);
      bVar2 = cmRuntimeDependencyArchive::Prepare((cmRuntimeDependencyArchive *)local_9c8);
      if (bVar2) {
        bVar2 = cmRuntimeDependencyArchive::GetRuntimeDependencies
                          ((cmRuntimeDependencyArchive *)local_9c8,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((long)&parsedArgs.BundleExecutable.field_2 + 8),
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&parsedArgs.Executables.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&parsedArgs.Directories.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (bVar2) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&unresolvedDeps.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&conflictingDeps.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range1);
          this_01 = cmRuntimeDependencyArchive::GetResolvedPaths_abi_cxx11_
                              ((cmRuntimeDependencyArchive *)local_9c8);
          __end1 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   ::begin(this_01);
          val = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   ::end(this_01);
          while( true ) {
            bVar2 = std::operator!=(&__end1,(_Self *)&val);
            if (!bVar2) break;
            __x = std::
                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ::operator*(&__end1);
            it._M_node._7_1_ = 1;
            local_a78._M_node =
                 (_Base_ptr)
                 std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(&__x->second);
            firstPath = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        std::
                        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::end(&__x->second);
            bVar2 = std::operator!=(&local_a78,(_Self *)&firstPath);
            if (!bVar2) {
              __assert_fail("it != val.second.end()",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmFileCommand.cxx"
                            ,0xaf5,
                            "bool cmFileCommand::HandleGetRuntimeDependenciesCommand(const std::vector<std::string> &)"
                           );
            }
            pbVar15 = std::
                      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*(&local_a78);
            do {
              __x_00 = std::
                       _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator++(&local_a78);
              paths.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)std::
                            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::end(&__x->second);
              bVar2 = std::operator!=(__x_00,(_Self *)&paths.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                     );
              if (!bVar2) goto LAB_001f63a4;
              file2 = std::
                      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*(&local_a78);
              bVar2 = cmsys::SystemTools::SameFile(pbVar15,file2);
            } while (bVar2);
            it._M_node._7_1_ = 0;
LAB_001f63a4:
            if ((it._M_node._7_1_ & 1) == 0) {
              uVar12 = std::__cxx11::string::empty();
              if ((uVar12 & 1) == 0) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&__range1,&__x->first);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_aa8);
                local_ab8._M_current =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_aa8);
                __gnu_cxx::
                __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ::__normal_iterator<std::__cxx11::string*>
                          ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                            *)&local_ab0,&local_ab8);
                iVar13 = std::
                         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::begin(&__x->second);
                iVar14 = std::
                         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::end(&__x->second);
                varName.field_2._8_8_ =
                     std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                     insert<std::_Rb_tree_const_iterator<std::__cxx11::string>,void>
                               ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *
                                )local_aa8,local_ab0,
                                (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )iVar13._M_node,
                                (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )iVar14._M_node);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&pathsStr.field_2 + 8),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&parsedArgs.UnresolvedDependenciesVar.field_2 + 8),"_");
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_af0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&pathsStr.field_2 + 8),&__x->first);
                std::__cxx11::string::~string((string *)(pathsStr.field_2._M_local_buf + 8));
                cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          ((string *)local_b30,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_aa8,";");
                pcVar1 = (this->super_cmCommand).Makefile;
                pcVar16 = (char *)std::__cxx11::string::c_str();
                cmMakefile::AddDefinition(pcVar1,(string *)local_af0,pcVar16);
                std::__cxx11::string::~string((string *)local_b30);
                std::__cxx11::string::~string((string *)local_af0);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_aa8);
                goto LAB_001f6776;
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&__range4);
              poVar7 = std::operator<<((ostream *)&__range4,"Multiple conflicting paths found for ")
              ;
              poVar7 = std::operator<<(poVar7,(string *)__x);
              std::operator<<(poVar7,":");
              __end4 = std::
                       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::begin(&__x->second);
              path = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end(&__x->second);
              while( true ) {
                bVar2 = std::operator!=(&__end4,(_Self *)&path);
                if (!bVar2) break;
                local_cc8 = std::
                            _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator*(&__end4);
                poVar7 = std::operator<<((ostream *)&__range4,"\n  ");
                std::operator<<(poVar7,(string *)local_cc8);
                std::
                _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator++(&__end4);
              }
              std::__cxx11::ostringstream::str();
              cmCommand::SetError(&this->super_cmCommand,&local_ce8);
              std::__cxx11::string::~string((string *)&local_ce8);
              cmSystemTools::SetFatalErrorOccured();
              this_local._7_1_ = 0;
              local_29c = 1;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__range4);
              goto LAB_001f6c1d;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&unresolvedDeps.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,pbVar15);
LAB_001f6776:
            std::
            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::operator++(&__end1);
          }
          psVar11 = cmRuntimeDependencyArchive::GetUnresolvedPaths_abi_cxx11_
                              ((cmRuntimeDependencyArchive *)local_9c8);
          bVar2 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty(psVar11);
          if (bVar2) {
LAB_001f69ef:
            uVar12 = std::__cxx11::string::empty();
            if ((uVar12 & 1) == 0) {
              cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        ((string *)((long)&val_2.field_2 + 8),
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&unresolvedDeps.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,";");
              pcVar1 = (this->super_cmCommand).Makefile;
              pcVar16 = (char *)std::__cxx11::string::c_str();
              cmMakefile::AddDefinition(pcVar1,(string *)local_518,pcVar16);
              std::__cxx11::string::~string((string *)(val_2.field_2._M_local_buf + 8));
            }
            uVar12 = std::__cxx11::string::empty();
            if ((uVar12 & 1) == 0) {
              cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        ((string *)((long)&val_3.field_2 + 8),
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&conflictingDeps.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,";");
              pcVar1 = (this->super_cmCommand).Makefile;
              pcVar16 = (char *)std::__cxx11::string::c_str();
              cmMakefile::AddDefinition
                        (pcVar1,(string *)((long)&parsedArgs.ResolvedDependenciesVar.field_2 + 8),
                         pcVar16);
              std::__cxx11::string::~string((string *)(val_3.field_2._M_local_buf + 8));
            }
            uVar12 = std::__cxx11::string::empty();
            if ((uVar12 & 1) == 0) {
              cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        ((string *)local_f18,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range1,";");
              pcVar1 = (this->super_cmCommand).Makefile;
              std::operator+(&local_f38,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&parsedArgs.UnresolvedDependenciesVar.field_2 + 8),"_FILENAMES")
              ;
              pcVar16 = (char *)std::__cxx11::string::c_str();
              cmMakefile::AddDefinition(pcVar1,&local_f38,pcVar16);
              std::__cxx11::string::~string((string *)&local_f38);
              std::__cxx11::string::~string((string *)local_f18);
            }
            this_local._7_1_ = 1;
            local_29c = 1;
          }
          else {
            uVar12 = std::__cxx11::string::empty();
            if ((uVar12 & 1) == 0) {
              local_cf8._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&conflictingDeps.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
              __gnu_cxx::
              __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ::__normal_iterator<std::__cxx11::string*>
                        ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          *)&local_cf0,&local_cf8);
              psVar11 = cmRuntimeDependencyArchive::GetUnresolvedPaths_abi_cxx11_
                                  ((cmRuntimeDependencyArchive *)local_9c8);
              iVar13 = std::
                       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::begin(psVar11);
              psVar11 = cmRuntimeDependencyArchive::GetUnresolvedPaths_abi_cxx11_
                                  ((cmRuntimeDependencyArchive *)local_9c8);
              iVar14 = std::
                       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::end(psVar11);
              it_1._M_node = (_Base_ptr)
                             std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                             ::insert<std::_Rb_tree_const_iterator<std::__cxx11::string>,void>
                                       ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                         *)&conflictingDeps.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                        local_cf0,iVar13._M_node,iVar14._M_node);
              goto LAB_001f69ef;
            }
            psVar11 = cmRuntimeDependencyArchive::GetUnresolvedPaths_abi_cxx11_
                                ((cmRuntimeDependencyArchive *)local_9c8);
            local_d18._M_node =
                 (_Base_ptr)
                 std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(psVar11);
            psVar11 = cmRuntimeDependencyArchive::GetUnresolvedPaths_abi_cxx11_
                                ((cmRuntimeDependencyArchive *)local_9c8);
            local_d20._M_node =
                 (_Base_ptr)
                 std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(psVar11);
            bVar2 = std::operator!=(&local_d18,&local_d20);
            if (!bVar2) {
              __assert_fail("it != archive.GetUnresolvedPaths().end()",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmFileCommand.cxx"
                            ,0xb1a,
                            "bool cmFileCommand::HandleGetRuntimeDependenciesCommand(const std::vector<std::string> &)"
                           );
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_e98);
            poVar7 = std::operator<<((ostream *)local_e98,"Could not resolve file ");
            pbVar15 = std::
                      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*(&local_d18);
            std::operator<<(poVar7,(string *)pbVar15);
            std::__cxx11::ostringstream::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)((long)&val_1.field_2 + 8));
            std::__cxx11::string::~string((string *)(val_1.field_2._M_local_buf + 8));
            cmSystemTools::SetFatalErrorOccured();
            this_local._7_1_ = 0;
            local_29c = 1;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_e98);
          }
LAB_001f6c1d:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range1);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&conflictingDeps.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&unresolvedDeps.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else {
          cmSystemTools::SetFatalErrorOccured();
          this_local._7_1_ = 0;
          local_29c = 1;
        }
      }
      else {
        cmSystemTools::SetFatalErrorOccured();
        this_local._7_1_ = 0;
        local_29c = 1;
      }
      cmRuntimeDependencyArchive::~cmRuntimeDependencyArchive
                ((cmRuntimeDependencyArchive *)local_9c8);
    }
  }
  HandleGetRuntimeDependenciesCommand::Arguments::~Arguments((Arguments *)local_518);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&parsedArgs.PostExcludeRegexes.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&keywordsMissingValues.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_001f6cd1:
  std::__cxx11::string::~string((string *)local_d8);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFileCommand::HandleGetRuntimeDependenciesCommand(
  std::vector<std::string> const& args)
{
  static const std::set<std::string> supportedPlatforms = { "Windows", "Linux",
                                                            "Darwin" };
  std::string platform =
    this->Makefile->GetSafeDefinition("CMAKE_HOST_SYSTEM_NAME");
  if (!supportedPlatforms.count(platform)) {
    std::ostringstream e;
    e << "GET_RUNTIME_DEPENDENCIES is not supported on system \"" << platform
      << "\"";
    this->SetError(e.str());
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }

  if (this->Makefile->GetState()->GetMode() == cmState::Project) {
    this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING,
                                 "You have used file(GET_RUNTIME_DEPENDENCIES)"
                                 " in project mode. This is probably not what "
                                 "you intended to do. Instead, please consider"
                                 " using it in an install(CODE) or "
                                 "install(SCRIPT) command. For example:"
                                 "\n  install(CODE [["
                                 "\n    file(GET_RUNTIME_DEPENDENCIES"
                                 "\n      # ..."
                                 "\n      )"
                                 "\n    ]])");
  }

  struct Arguments
  {
    std::string ResolvedDependenciesVar;
    std::string UnresolvedDependenciesVar;
    std::string ConflictingDependenciesPrefix;
    std::string BundleExecutable;
    std::vector<std::string> Executables;
    std::vector<std::string> Libraries;
    std::vector<std::string> Directories;
    std::vector<std::string> Modules;
    std::vector<std::string> PreIncludeRegexes;
    std::vector<std::string> PreExcludeRegexes;
    std::vector<std::string> PostIncludeRegexes;
    std::vector<std::string> PostExcludeRegexes;
  };

  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("RESOLVED_DEPENDENCIES_VAR"_s, &Arguments::ResolvedDependenciesVar)
      .Bind("UNRESOLVED_DEPENDENCIES_VAR"_s,
            &Arguments::UnresolvedDependenciesVar)
      .Bind("CONFLICTING_DEPENDENCIES_PREFIX"_s,
            &Arguments::ConflictingDependenciesPrefix)
      .Bind("BUNDLE_EXECUTABLE"_s, &Arguments::BundleExecutable)
      .Bind("EXECUTABLES"_s, &Arguments::Executables)
      .Bind("LIBRARIES"_s, &Arguments::Libraries)
      .Bind("MODULES"_s, &Arguments::Modules)
      .Bind("DIRECTORIES"_s, &Arguments::Directories)
      .Bind("PRE_INCLUDE_REGEXES"_s, &Arguments::PreIncludeRegexes)
      .Bind("PRE_EXCLUDE_REGEXES"_s, &Arguments::PreExcludeRegexes)
      .Bind("POST_INCLUDE_REGEXES"_s, &Arguments::PostIncludeRegexes)
      .Bind("POST_EXCLUDE_REGEXES"_s, &Arguments::PostExcludeRegexes);

  std::vector<std::string> unrecognizedArguments;
  std::vector<std::string> keywordsMissingValues;
  auto parsedArgs =
    parser.Parse(cmMakeRange(args).advance(1), &unrecognizedArguments,
                 &keywordsMissingValues);
  auto argIt = unrecognizedArguments.begin();
  if (argIt != unrecognizedArguments.end()) {
    std::ostringstream e;
    e << "Unrecognized argument: \"" << *argIt << "\"";
    this->SetError(e.str());
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }
  argIt = keywordsMissingValues.begin();
  if (argIt != keywordsMissingValues.end()) {
    std::ostringstream e;
    e << "Keyword missing value: " << *argIt;
    this->SetError(e.str());
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }

  cmRuntimeDependencyArchive archive(
    this, parsedArgs.Directories, parsedArgs.BundleExecutable,
    parsedArgs.PreIncludeRegexes, parsedArgs.PreExcludeRegexes,
    parsedArgs.PostIncludeRegexes, parsedArgs.PostExcludeRegexes);
  if (!archive.Prepare()) {
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }

  if (!archive.GetRuntimeDependencies(
        parsedArgs.Executables, parsedArgs.Libraries, parsedArgs.Modules)) {
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }

  std::vector<std::string> deps, unresolvedDeps, conflictingDeps;
  for (auto const& val : archive.GetResolvedPaths()) {
    bool unique = true;
    auto it = val.second.begin();
    assert(it != val.second.end());
    auto const& firstPath = *it;
    while (++it != val.second.end()) {
      if (!cmSystemTools::SameFile(firstPath, *it)) {
        unique = false;
        break;
      }
    }

    if (unique) {
      deps.push_back(firstPath);
    } else if (!parsedArgs.ConflictingDependenciesPrefix.empty()) {
      conflictingDeps.push_back(val.first);
      std::vector<std::string> paths;
      paths.insert(paths.begin(), val.second.begin(), val.second.end());
      std::string varName =
        parsedArgs.ConflictingDependenciesPrefix + "_" + val.first;
      std::string pathsStr = cmJoin(paths, ";");
      this->Makefile->AddDefinition(varName, pathsStr.c_str());
    } else {
      std::ostringstream e;
      e << "Multiple conflicting paths found for " << val.first << ":";
      for (auto const& path : val.second) {
        e << "\n  " << path;
      }
      this->SetError(e.str());
      cmSystemTools::SetFatalErrorOccured();
      return false;
    }
  }
  if (!archive.GetUnresolvedPaths().empty()) {
    if (!parsedArgs.UnresolvedDependenciesVar.empty()) {
      unresolvedDeps.insert(unresolvedDeps.begin(),
                            archive.GetUnresolvedPaths().begin(),
                            archive.GetUnresolvedPaths().end());
    } else {
      auto it = archive.GetUnresolvedPaths().begin();
      assert(it != archive.GetUnresolvedPaths().end());
      std::ostringstream e;
      e << "Could not resolve file " << *it;
      this->SetError(e.str());
      cmSystemTools::SetFatalErrorOccured();
      return false;
    }
  }

  if (!parsedArgs.ResolvedDependenciesVar.empty()) {
    std::string val = cmJoin(deps, ";");
    this->Makefile->AddDefinition(parsedArgs.ResolvedDependenciesVar,
                                  val.c_str());
  }
  if (!parsedArgs.UnresolvedDependenciesVar.empty()) {
    std::string val = cmJoin(unresolvedDeps, ";");
    this->Makefile->AddDefinition(parsedArgs.UnresolvedDependenciesVar,
                                  val.c_str());
  }
  if (!parsedArgs.ConflictingDependenciesPrefix.empty()) {
    std::string val = cmJoin(conflictingDeps, ";");
    this->Makefile->AddDefinition(
      parsedArgs.ConflictingDependenciesPrefix + "_FILENAMES", val.c_str());
  }
  return true;
}